

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::AlignTextToFramePadding(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->SkipItems == false) {
    fVar1 = (pIVar5->Style).FramePadding.y;
    fVar2 = (pIVar3->DC).CurrLineTextBaseOffset;
    auVar6 = ZEXT416((uint)(fVar1 + fVar1 + pIVar5->FontSize));
    auVar7 = ZEXT416((uint)(pIVar3->DC).CurrLineSize.y);
    auVar4 = vcmpss_avx(auVar6,auVar7,2);
    auVar4 = vblendvps_avx(auVar6,auVar7,auVar4);
    (pIVar3->DC).CurrLineSize.y = auVar4._0_4_;
    auVar6 = ZEXT416((uint)fVar2);
    auVar4 = vcmpss_avx(ZEXT416((uint)fVar1),auVar6,2);
    auVar4 = vblendvps_avx(ZEXT416((uint)fVar1),auVar6,auVar4);
    (pIVar3->DC).CurrLineTextBaseOffset = auVar4._0_4_;
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }